

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::ForAllUnionObjectVariantsBesidesNone
          (RustGenerator *this,EnumDef *enum_def,function<void_()> *cb)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  string local_168;
  allocator<char> local_141;
  string local_140;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  EnumVal *local_38;
  EnumVal *enum_val;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_28;
  const_iterator it;
  function<void_()> *cb_local;
  EnumDef *enum_def_local;
  RustGenerator *this_local;
  
  it._M_current = (EnumVal **)cb;
  pvVar2 = EnumDef::Vals(enum_def);
  local_28._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = EnumDef::Vals(enum_def);
    enum_val = (EnumVal *)
               std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                         (pvVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&enum_val);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppEVar3;
    if ((local_38->union_type).base_type != BASE_TYPE_NONE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"VARIANT_NAME",&local_59);
      IdlNamer::Variant_abi_cxx11_(&local_90,&this->namer_,local_38);
      CodeWriter::SetValue(&this->code_,&local_58,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"NATIVE_VARIANT",&local_b1);
      IdlNamer::LegacyRustNativeVariant_abi_cxx11_(&local_d8,&this->namer_,local_38);
      CodeWriter::SetValue(&this->code_,&local_b0,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"U_ELEMENT_NAME",&local_f9);
      Namer::Method<flatbuffers::EnumVal>(&local_120,&(this->namer_).super_Namer,local_38);
      CodeWriter::SetValue(&this->code_,&local_f8,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"U_ELEMENT_TABLE_TYPE",&local_141);
      NamespacedNativeName_abi_cxx11_(&local_168,this,(local_38->union_type).struct_def);
      CodeWriter::SetValue(&this->code_,&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      CodeWriter::IncrementIdentLevel(&this->code_);
      std::function<void_()>::operator()(cb);
      CodeWriter::DecrementIdentLevel(&this->code_);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void ForAllUnionObjectVariantsBesidesNone(const EnumDef &enum_def,
                                            std::function<void()> cb) {
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &enum_val = **it;
      if (enum_val.union_type.base_type == BASE_TYPE_NONE) continue;
      code_.SetValue("VARIANT_NAME", namer_.Variant(enum_val));
      // For legacy reasons, enum variants are Keep case while enum native
      // variants are UpperCamel case.
      code_.SetValue("NATIVE_VARIANT",
                     namer_.LegacyRustNativeVariant(enum_val));
      code_.SetValue("U_ELEMENT_NAME", namer_.Method(enum_val));
      code_.SetValue("U_ELEMENT_TABLE_TYPE",
                     NamespacedNativeName(*enum_val.union_type.struct_def));
      code_.IncrementIdentLevel();
      cb();
      code_.DecrementIdentLevel();
    }
  }